

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockBaseCase::init
          (InterfaceBlockBaseCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ContextType type;
  GLSLVersion version;
  Program *this_00;
  Shader *pSVar3;
  StructType *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *pcVar5;
  vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_> *this_02;
  InterfaceBlock precedingInterfaceBlock;
  string local_188;
  VarType local_168;
  VarType local_150;
  VariableDeclaration local_138;
  Layout local_d4;
  InterfaceBlock local_c0;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  pSVar3 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_COMPUTE,version);
  glu::InterfaceBlock::InterfaceBlock(&local_c0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.interfaceName,0,(char *)local_c0.interfaceName._M_string_length,
             0x1cb5385);
  local_c0.layout.binding = 0;
  local_c0.storage = this->m_storage;
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.instanceName,0,(char *)local_c0.instanceName._M_string_length,
             0x1cb5398);
  glu::VarType::VarType(&local_168,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  paVar4 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"precedingMember","");
  glu::Layout::Layout((Layout *)&local_150,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_150,0
            );
  pvVar1 = &local_c0.variables;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_150,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_168,&local_150,-1);
    local_188._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"precedingMemberUnsizedArray","");
    glu::Layout::Layout(&local_d4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,&local_d4,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  }
  else {
    glu::VarType::VarType(&local_150,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_168,&local_150,2);
    local_188._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"precedingMemberArray","");
    glu::Layout::Layout(&local_d4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,&local_d4,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  glu::VarType::~VarType(&local_150);
  this_02 = &(pSVar3->m_defaultBlock).interfaceBlocks;
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&local_c0);
  if (local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector(pvVar1);
  paVar2 = &local_c0.instanceName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.instanceName._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.instanceName._M_dataplus._M_p,
                    local_c0.instanceName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.interfaceName._M_dataplus._M_p != &local_c0.interfaceName.field_2) {
    operator_delete(local_c0.interfaceName._M_dataplus._M_p,
                    local_c0.interfaceName.field_2._M_allocated_capacity + 1);
  }
  glu::InterfaceBlock::InterfaceBlock(&local_c0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.interfaceName,0,(char *)local_c0.interfaceName._M_string_length,
             0x1cb4c77);
  local_c0.layout.binding = 1;
  local_c0.storage = this->m_storage;
  pcVar5 = "targetInstance";
  if (this->m_caseType == CASE_UNNAMED_BLOCK) {
    pcVar5 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.instanceName,0,(char *)local_c0.instanceName._M_string_length,
             (ulong)pcVar5);
  if (this->m_caseType == CASE_BLOCK_ARRAY) {
    local_138.layout.location = 2;
    if (local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_c0.dimensions,
                 (iterator)
                 local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_138);
    }
    else {
      *local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 2;
      local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  glu::VarType::VarType(&local_168,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  local_188._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"blockMemberBasic","");
  glu::Layout::Layout((Layout *)&local_150,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_150,0
            );
  pvVar1 = &local_c0.variables;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  glu::VarType::VarType(&local_150,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType(&local_168,&local_150,3);
  local_188._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"blockMemberArray","");
  glu::Layout::Layout(&local_d4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,&local_d4,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  glu::VarType::~VarType(&local_150);
  this_01 = (StructType *)operator_new(0x38);
  (this_01->m_typeName)._M_dataplus._M_p = (pointer)&(this_01->m_typeName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_01,"StructType","");
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::VarType::VarType((VarType *)&local_138,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"structMemberBasic",(VarType *)&local_138);
  glu::VarType::~VarType((VarType *)&local_138);
  glu::VarType::VarType((VarType *)&local_188,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType((VarType *)&local_138,(VarType *)&local_188,2);
  glu::StructType::addMember(this_01,"structMemberArray",(VarType *)&local_138);
  glu::VarType::~VarType((VarType *)&local_138);
  glu::VarType::~VarType((VarType *)&local_188);
  glu::VarType::VarType(&local_150,this_01);
  glu::VarType::VarType(&local_168,&local_150,2);
  local_188._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"blockMemberStruct","");
  glu::Layout::Layout(&local_d4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,&local_d4,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  glu::VarType::~VarType(&local_150);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_150,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_168,&local_150,-1);
    local_188._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"blockMemberUnsizedArray","");
    glu::Layout::Layout(&local_d4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,&local_d4,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
      operator_delete(local_138.name._M_dataplus._M_p,
                      local_138.name.field_2._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType(&local_138.varType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar4) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType(&local_168);
    glu::VarType::~VarType(&local_150);
  }
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&local_c0);
  if (local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector(pvVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.instanceName._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.instanceName._M_dataplus._M_p,
                    local_c0.instanceName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.interfaceName._M_dataplus._M_p != &local_c0.interfaceName.field_2) {
    operator_delete(local_c0.interfaceName._M_dataplus._M_p,
                    local_c0.interfaceName.field_2._M_allocated_capacity + 1);
  }
  glu::InterfaceBlock::InterfaceBlock(&local_c0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.interfaceName,0,(char *)local_c0.interfaceName._M_string_length,
             0x1cb545b);
  local_c0.layout.binding = 3;
  local_c0.storage = this->m_storage;
  std::__cxx11::string::_M_replace
            ((ulong)&local_c0.instanceName,0,(char *)local_c0.instanceName._M_string_length,
             0x1cb546d);
  glu::VarType::VarType(&local_168,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  local_188._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"trailingMember","");
  glu::Layout::Layout((Layout *)&local_150,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_138,&local_168,&local_188,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_150,0
            );
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(&local_c0.variables,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.name._M_dataplus._M_p != &local_138.name.field_2) {
    operator_delete(local_138.name._M_dataplus._M_p,local_138.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_138.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_168);
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&local_c0);
  if (local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
            (&local_c0.variables);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.instanceName._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.instanceName._M_dataplus._M_p,
                    local_c0.instanceName.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_c0.interfaceName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.interfaceName._M_dataplus._M_p != paVar4) {
    operator_delete(local_c0.interfaceName._M_dataplus._M_p,
                    local_c0.interfaceName.field_2._M_allocated_capacity + 1);
    paVar4 = extraout_RAX;
  }
  return (int)paVar4;
}

Assistant:

void InterfaceBlockBaseCase::init (void)
{
	const glu::GLSLVersion				glslVersion	= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	ProgramInterfaceDefinition::Shader*	shader;

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	// PrecedingInterface
	{
		glu::InterfaceBlock precedingInterfaceBlock;

		precedingInterfaceBlock.interfaceName	= "PrecedingInterface";
		precedingInterfaceBlock.layout.binding	= 0;
		precedingInterfaceBlock.storage			= m_storage;
		precedingInterfaceBlock.instanceName	= "precedingInstance";

		precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "precedingMember"));

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "precedingMemberUnsizedArray"));
		else
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2), "precedingMemberArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(precedingInterfaceBlock);
	}

	// TargetInterface
	{
		glu::InterfaceBlock targetInterfaceBlock;

		targetInterfaceBlock.interfaceName	= "TargetInterface";
		targetInterfaceBlock.layout.binding	= 1;
		targetInterfaceBlock.storage		= m_storage;

		if (m_caseType == CASE_UNNAMED_BLOCK)
			targetInterfaceBlock.instanceName = "";
		else
			targetInterfaceBlock.instanceName = "targetInstance";

		if (m_caseType == CASE_BLOCK_ARRAY)
			targetInterfaceBlock.dimensions.push_back(2);

		// Basic type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "blockMemberBasic"));
		}

		// Array type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 3), "blockMemberArray"));
		}

		// Struct type
		{
			glu::StructType* structPtr = new glu::StructType("StructType");
			structPtr->addMember("structMemberBasic", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));
			structPtr->addMember("structMemberArray", glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2));

			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(structPtr), 2), "blockMemberStruct"));
		}

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "blockMemberUnsizedArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(targetInterfaceBlock);
	}

	// TrailingInterface
	{
		glu::InterfaceBlock trailingInterfaceBlock;

		trailingInterfaceBlock.interfaceName	= "TrailingInterface";
		trailingInterfaceBlock.layout.binding	= 3;
		trailingInterfaceBlock.storage			= m_storage;
		trailingInterfaceBlock.instanceName		= "trailingInstance";
		trailingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "trailingMember"));

		shader->getDefaultBlock().interfaceBlocks.push_back(trailingInterfaceBlock);
	}

	DE_ASSERT(m_program->isValid());
}